

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  SectionTracker *this_00;
  ITracker *pIVar1;
  SourceLineInfo local_88 [2];
  allocator local_61;
  string local_60;
  NameAndLocation local_40;
  TrackerContext *local_10;
  TrackerContext *this_local;
  
  local_10 = this;
  this_00 = (SectionTracker *)operator_new(0x88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"{root}",&local_61);
  SourceLineInfo::SourceLineInfo
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
             ,0x189c);
  NameAndLocation::NameAndLocation(&local_40,&local_60,local_88);
  SectionTracker::SectionTracker(this_00,&local_40,this,(ITracker *)0x0);
  Ptr<Catch::TestCaseTracking::ITracker>::operator=(&this->m_rootTracker,(ITracker *)this_00);
  NameAndLocation::~NameAndLocation(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  pIVar1 = Ptr<Catch::TestCaseTracking::ITracker>::operator*(&this->m_rootTracker);
  return pIVar1;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
        m_rootTracker = new SectionTracker( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, CATCH_NULL );
        m_currentTracker = CATCH_NULL;
        m_runState = Executing;
        return *m_rootTracker;
    }